

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_str_getcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  jx9_value *pValue;
  int delim;
  int encl;
  int escape;
  void *in_stack_ffffffffffffffb8;
  int i;
  int nLen;
  char *local_38;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    local_38 = jx9_value_to_string(*apArg,&nLen);
    if (nArg == 1) {
      escape = 0x5c;
      encl = 0x22;
      delim = 0x2c;
    }
    else {
      delim = 0x2c;
      if (((apArg[1]->iFlags & 1) != 0) && (pcVar1 = jx9_value_to_string(apArg[1],&i), 0 < i)) {
        delim = (int)*pcVar1;
      }
      escape = 0x5c;
      if ((uint)nArg < 3) {
        encl = 0x22;
      }
      else {
        encl = 0x22;
        if (((apArg[2]->iFlags & 1) != 0) && (pcVar1 = jx9_value_to_string(apArg[2],&i), 0 < i)) {
          encl = (int)*pcVar1;
        }
        if (((nArg != 3) && ((apArg[3]->iFlags & 1) != 0)) &&
           (pcVar1 = jx9_value_to_string(apArg[3],&i), 0 < i)) {
          escape = (int)*pcVar1;
        }
      }
    }
    pValue = jx9_context_new_array(pCtx);
    if (pValue != (jx9_value *)0x0) {
      jx9ProcessCsv(local_38,nLen,delim,encl,escape,(_func_sxi32_char_ptr_int_void_ptr *)pValue,
                    in_stack_ffffffffffffffb8);
      jx9_result_value(pCtx,pValue);
      return 0;
    }
    jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int jx9Builtin_str_getcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zInput, *zPtr;
	jx9_value *pArray;
	int delim  = ',';   /* Delimiter */
	int encl   = '"' ;  /* Enclosure */
	int escape = '\\';  /* Escape character */
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the raw input */
	zInput = jx9_value_to_string(apArg[0], &nLen);
	if( nArg > 1 ){
		int i;
		if( jx9_value_is_string(apArg[1]) ){
			/* Extract the delimiter */
			zPtr = jx9_value_to_string(apArg[1], &i);
			if( i > 0 ){
				delim = zPtr[0];
			}
		}
		if( nArg > 2 ){
			if( jx9_value_is_string(apArg[2]) ){
				/* Extract the enclosure */
				zPtr = jx9_value_to_string(apArg[2], &i);
				if( i > 0 ){
					encl = zPtr[0];
				}
			}
			if( nArg > 3 ){
				if( jx9_value_is_string(apArg[3]) ){
					/* Extract the escape character */
					zPtr = jx9_value_to_string(apArg[3], &i);
					if( i > 0 ){
						escape = zPtr[0];
					}
				}
			}
		}
	}
	/* Create our array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Parse the raw input */
	jx9ProcessCsv(zInput, nLen, delim, encl, escape, jx9CsvConsumer, pArray);
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}